

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O0

void __thiscall
Inferences::URResolution::Item::resolveLiteral
          (Item *this,uint idx,
          QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *unif,
          Clause *premise,bool useQuerySubstitution)

{
  Color CVar1;
  bool bVar2;
  Color CVar3;
  QuestionAnsweringMode QVar4;
  int iVar5;
  Literal **ppLVar6;
  Clause **ppCVar7;
  Literal *pLVar8;
  AnswerLiteralManager *pAVar9;
  undefined4 extraout_var;
  size_t sVar10;
  Clause *in_RCX;
  SmartPtr<Indexing::ResultSubstitution> *in_RDX;
  uint in_ESI;
  long in_RDI;
  Literal **lit;
  uint i;
  uint clen;
  uint nonGroundCnt;
  Literal *resolved;
  bool neg;
  Literal *premAnsLit;
  bool synthesis;
  Literal *rlit;
  Clause *in_stack_ffffffffffffff58;
  undefined1 result;
  Clause *in_stack_ffffffffffffff60;
  Clause *in_stack_ffffffffffffff68;
  uint local_5c;
  uint local_54;
  Literal *local_50;
  Clause *local_40;
  
  Lib::Stack<Kernel::Literal_*>::operator[]
            ((Stack<Kernel::Literal_*> *)(in_RDI + 0x30),(ulong)in_ESI);
  ppLVar6 = Lib::Stack<Kernel::Literal_*>::operator[]
                      ((Stack<Kernel::Literal_*> *)(in_RDI + 0x30),(ulong)in_ESI);
  *ppLVar6 = (Literal *)0x0;
  ppCVar7 = Lib::DArray<Kernel::Clause_*>::operator[]
                      ((DArray<Kernel::Clause_*> *)(in_RDI + 0x18),(ulong)in_ESI);
  *ppCVar7 = in_RCX;
  CVar1 = *(Color *)(in_RDI + 0x10);
  CVar3 = Kernel::Clause::color(in_stack_ffffffffffffff60);
  *(Color *)(in_RDI + 0x10) = CVar1 | CVar3;
  if ((*(long *)(in_RDI + 0x50) != 0) && (bVar2 = Kernel::Term::ground((Term *)0x83e484), !bVar2)) {
    Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(in_RDX);
    pLVar8 = Indexing::ResultSubstitution::apply<Kernel::Literal*>
                       ((ResultSubstitution *)in_stack_ffffffffffffff68,
                        (Literal *)in_stack_ffffffffffffff60,
                        SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
    *(Literal **)(in_RDI + 0x50) = pLVar8;
  }
  QVar4 = Shell::Options::questionAnswering(Lib::env);
  if ((QVar4 == SYNTHESIS) && (bVar2 = Kernel::Clause::hasAnswerLiteral((Clause *)0x83e4f4), bVar2))
  {
    local_40 = (Clause *)Kernel::Clause::getAnswerLiteral(in_stack_ffffffffffffff68);
    bVar2 = Kernel::Term::ground((Term *)0x83e519);
    if (!bVar2) {
      Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(in_RDX);
      local_40 = (Clause *)
                 Indexing::ResultSubstitution::apply<Kernel::Literal*>
                           ((ResultSubstitution *)in_stack_ffffffffffffff68,
                            (Literal *)in_stack_ffffffffffffff60,
                            SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
    }
    result = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
    if (*(long *)(in_RDI + 0x50) == 0) {
      *(Clause **)(in_RDI + 0x50) = local_40;
    }
    else if (*(Clause **)(in_RDI + 0x50) != local_40) {
      bVar2 = Kernel::Literal::isNegative((Literal *)0x83e585);
      Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(in_RDX);
      local_50 = Indexing::ResultSubstitution::apply<Kernel::Literal*>
                           ((ResultSubstitution *)in_stack_ffffffffffffff68,
                            (Literal *)in_stack_ffffffffffffff60,(bool)result);
      if (bVar2) {
        local_50 = Kernel::Literal::complementaryLiteral((Literal *)in_stack_ffffffffffffff60);
      }
      pAVar9 = Shell::AnswerLiteralManager::getInstance();
      if (bVar2) {
        in_stack_ffffffffffffff60 = *(Clause **)(in_RDI + 0x50);
        in_stack_ffffffffffffff58 = local_40;
      }
      else {
        in_stack_ffffffffffffff58 = *(Clause **)(in_RDI + 0x50);
        in_stack_ffffffffffffff60 = local_40;
      }
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffff60;
      iVar5 = (*pAVar9->_vptr_AnswerLiteralManager[5])
                        (pAVar9,local_50,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      *(ulong *)(in_RDI + 0x50) = CONCAT44(extraout_var,iVar5);
    }
  }
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_54 = 0;
    sVar10 = Lib::Stack<Kernel::Literal_*>::size((Stack<Kernel::Literal_*> *)(in_RDI + 0x30));
    for (local_5c = 0; local_5c < (uint)sVar10; local_5c = local_5c + 1) {
      ppLVar6 = Lib::Stack<Kernel::Literal_*>::operator[]
                          ((Stack<Kernel::Literal_*> *)(in_RDI + 0x30),(ulong)local_5c);
      if (*ppLVar6 != (Literal *)0x0) {
        Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(in_RDX);
        pLVar8 = Indexing::ResultSubstitution::apply<Kernel::Literal*>
                           ((ResultSubstitution *)in_stack_ffffffffffffff68,
                            (Literal *)in_stack_ffffffffffffff60,
                            SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
        *ppLVar6 = pLVar8;
        bVar2 = Kernel::Term::ground((Term *)0x83e700);
        if (!bVar2) {
          local_54 = local_54 + 1;
        }
      }
    }
    *(bool *)(in_RDI + 1) = local_54 < 2;
  }
  return;
}

Assistant:

void resolveLiteral(unsigned idx, QueryRes<ResultSubstitutionSP, LiteralClause>& unif, Clause* premise, bool useQuerySubstitution)
  {
    Literal* rlit = _lits[idx];
    _lits[idx] = 0;
    _premises[idx] = premise;
    _color = static_cast<Color>(_color | premise->color());
    ASS_NEQ(_color, COLOR_INVALID)

    if (_ansLit && !_ansLit->ground()) {
      _ansLit = unif.unifier->apply(_ansLit, !useQuerySubstitution);
    }
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    if (synthesis && premise->hasAnswerLiteral()) {
      Literal* premAnsLit = premise->getAnswerLiteral();
      if (!premAnsLit->ground()) {
        premAnsLit = unif.unifier->apply(premAnsLit, useQuerySubstitution);
      }
      if (!_ansLit) {
        _ansLit = premAnsLit;
      } else if (_ansLit != premAnsLit) {
        bool neg = rlit->isNegative();
        Literal* resolved = unif.unifier->apply(rlit, !useQuerySubstitution);
        if (neg) {
          resolved = Literal::complementaryLiteral(resolved);
        }
        _ansLit = AnswerLiteralManager::getInstance()->makeITEAnswerLiteral(resolved, neg ? _ansLit : premAnsLit, neg ? premAnsLit : _ansLit);
      }
    }

    if(_atMostOneNonGround) {
      return;
    }

    unsigned nonGroundCnt = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      Literal*& lit = _lits[i];
      if(!lit) {
        continue;
      }
      lit = unif.unifier->apply(lit, !useQuerySubstitution);
      if(!lit->ground()) {
        nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;
  }